

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  char *pcVar1;
  long lVar2;
  StringEntry *pSVar3;
  StringEntry *pSVar4;
  size_type sVar5;
  size_t sVar6;
  long *plVar7;
  ostream *poVar8;
  undefined1 *puVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  string *psVar13;
  string *psVar14;
  ulong uVar15;
  bool *pbVar16;
  bool bVar17;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  undefined1 auStack_398 [12];
  uint local_38c;
  string *local_388;
  bool *local_380;
  string *local_378;
  string *local_370;
  string *local_368;
  ulong local_360;
  StringEntry *local_358 [2];
  long local_348 [3];
  cmELF local_330;
  string *local_308;
  StringEntry *local_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  undefined1 local_2d8 [16];
  _func_int *local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  pointer local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar2 = 0xa0;
  puVar9 = local_b8;
  do {
    *(undefined1 **)(puVar9 + -0x10) = puVar9;
    *(undefined8 *)(puVar9 + -8) = 0;
    *puVar9 = 0;
    *(undefined1 **)(puVar9 + 0x10) = puVar9 + 0x20;
    *(undefined8 *)(puVar9 + 0x18) = 0;
    puVar9[0x20] = 0;
    puVar9 = puVar9 + 0x50;
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != 0);
  local_370 = newRPath;
  local_368 = oldRPath;
  cmELF::cmELF(&local_330,(file->_M_dataplus)._M_p);
  local_348[0] = 0;
  local_348[1] = 0;
  local_358[0] = (StringEntry *)0x0;
  local_358[1] = (StringEntry *)0x0;
  pSVar3 = cmELF::GetRPath(&local_330);
  bVar17 = pSVar3 != (StringEntry *)0x0;
  if (bVar17) {
    local_358[0] = (StringEntry *)0x4b2f4d;
    local_348[0] = (long)pSVar3;
  }
  pSVar4 = cmELF::GetRunPath(&local_330);
  if (pSVar4 == (StringEntry *)0x0) {
    local_360 = 1;
    if (pSVar3 == (StringEntry *)0x0) {
      bVar17 = local_370->_M_string_length == 0;
      if (emsg != (string *)0x0 && !bVar17) {
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x4b17bc);
        std::__cxx11::string::_M_append((char *)emsg,(ulong)local_330.ErrorMessage._M_dataplus._M_p)
        ;
      }
      cmELF::~cmELF(&local_330);
      goto LAB_002954c8;
    }
  }
  else {
    *(StringEntry **)((long)local_348 + (ulong)((uint)bVar17 * 8)) = pSVar4;
    *(char **)((long)local_358 + (ulong)((uint)bVar17 * 8)) = "RUNPATH";
    local_360 = (ulong)(bVar17 + 1);
  }
  local_308 = file;
  uVar15 = 0;
  uVar11 = 0;
  local_388 = emsg;
  local_380 = changed;
  do {
    if (uVar11 == 0) {
      psVar13 = (string *)local_348[uVar15];
LAB_00294ea1:
      local_38c = uVar11;
      local_378 = psVar13;
      sVar5 = cmSystemToolsFindRPath(psVar13,local_368);
      if (sVar5 == 0xffffffffffffffff) {
        sVar5 = cmSystemToolsFindRPath(local_378,local_370);
        psVar13 = local_388;
        psVar14 = local_388;
        uVar11 = local_38c;
        if (sVar5 == 0xffffffffffffffff) {
          if (local_388 != (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"The current ",0xc);
            pSVar3 = local_358[uVar15];
            if (pSVar3 == (StringEntry *)0x0) {
              std::ios::clear((int)(auStack_398 + (long)*(_func_int **)(local_2d8._0_8_ + -0x18)) +
                              0xc0);
            }
            else {
              sVar6 = strlen((char *)pSVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,(char *)pSVar3,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"  ",2);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2d8,(local_378->_M_dataplus)._M_p,
                                local_378->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_368->_M_dataplus)._M_p,local_368->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)psVar13,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            std::ios_base::~ios_base(local_268);
          }
          goto LAB_002953bc;
        }
      }
      else {
        lVar2 = (long)(int)local_38c;
        uVar12 = local_378[1]._M_string_length;
        local_d8[lVar2 * 10] = local_378[1]._M_dataplus._M_p;
        local_c8[lVar2 * 10 + -1] = uVar12;
        pSVar3 = local_358[uVar15];
        pcVar1 = (char *)local_c8[lVar2 * 10 + 1];
        strlen((char *)pSVar3);
        local_300 = pSVar3;
        std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar2 * 10),0,pcVar1,(ulong)pSVar3);
        std::__cxx11::string::substr((ulong)local_2d8,(ulong)local_378);
        this = local_a8 + lVar2 * 0x50;
        std::__cxx11::string::operator=(this,(string *)local_2d8);
        if ((_func_int **)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
        }
        std::__cxx11::string::_M_append((char *)this,(ulong)(local_370->_M_dataplus)._M_p);
        std::__cxx11::string::substr((ulong)local_2d8,(ulong)local_378);
        std::__cxx11::string::_M_append((char *)this,local_2d8._0_8_);
        psVar14 = local_388;
        if ((_func_int **)local_2d8._0_8_ != local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8[0] + 1));
        }
        if (local_c8[lVar2 * 10 + -1] < local_a0[lVar2 * 10] + 1) {
          if (psVar14 != (string *)0x0) {
            std::__cxx11::string::_M_replace
                      ((ulong)psVar14,0,(char *)psVar14->_M_string_length,0x4b182c);
            std::__cxx11::string::append((char *)psVar14);
            std::__cxx11::string::append((char *)psVar14);
          }
LAB_002953bc:
          cmELF::~cmELF(&local_330);
          bVar17 = false;
          goto LAB_002954c8;
        }
        uVar11 = local_38c + 1;
      }
    }
    else {
      psVar13 = (string *)local_348[uVar15];
      psVar14 = local_388;
      if (local_d8[0] != psVar13[1]._M_dataplus._M_p) goto LAB_00294ea1;
    }
    uVar15 = uVar15 + 1;
  } while (local_360 != uVar15);
  cmELF::~cmELF(&local_330);
  bVar17 = true;
  if (uVar11 != 0) {
    std::ofstream::ofstream(local_2d8,(local_308->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    pbVar16 = local_380;
    if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) == 0) {
      if ((int)uVar11 < 1) {
        bVar10 = 0;
      }
      else {
        uVar15 = 0;
        do {
          plVar7 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[uVar15 * 10],0);
          psVar13 = local_388;
          if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
            if (local_388 == (string *)0x0) {
              bVar10 = 1;
              pbVar16 = local_380;
            }
            else {
              std::__cxx11::string::_M_replace
                        ((ulong)local_388,0,(char *)local_388->_M_string_length,0x4b1875);
              pbVar16 = local_380;
              std::__cxx11::string::_M_append((char *)psVar13,local_c8[uVar15 * 10]);
LAB_0029545c:
              bVar10 = 1;
              std::__cxx11::string::append((char *)local_388);
            }
            goto LAB_00295478;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2d8,*(char **)(local_a8 + uVar15 * 0x50),local_a0[uVar15 * 10]
                    );
          for (uVar12 = local_a0[uVar15 * 10]; pbVar16 = local_380, psVar13 = local_388,
              uVar12 < local_c8[uVar15 * 10 + -1]; uVar12 = uVar12 + 1) {
            local_330.Internal._0_1_ = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,(char *)&local_330,1);
          }
          if ((abStack_2b8[(long)*(_func_int **)(local_2d8._0_8_ + -0x18)] & 5) != 0) {
            if (local_388 != (string *)0x0) {
              std::__cxx11::string::_M_replace
                        ((ulong)local_388,0,(char *)local_388->_M_string_length,0x4b1887);
              std::__cxx11::string::_M_append((char *)psVar13,local_c8[uVar15 * 10]);
              goto LAB_0029545c;
            }
            bVar10 = 1;
            goto LAB_00295478;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar11);
        bVar10 = 0;
      }
    }
    else {
      bVar10 = 1;
      if (psVar14 != (string *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)psVar14,0,(char *)psVar14->_M_string_length,0x4b1856);
      }
    }
LAB_00295478:
    bVar17 = true;
    local_2d8._0_8_ = _VTT;
    *(undefined8 *)(local_2d8 + (long)_VTT[-3]) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)(local_2d8 + 8));
    std::ios_base::~ios_base(local_1e0);
    if (pbVar16 == (bool *)0x0 || bVar10 != 0) {
      bVar17 = (bool)(bVar10 ^ 1);
    }
    else {
      *pbVar16 = true;
    }
  }
LAB_002954c8:
  lVar2 = -0xa0;
  plVar7 = local_48;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    if (plVar7 + -4 != (long *)plVar7[-6]) {
      operator_delete((long *)plVar7[-6],plVar7[-4] + 1);
    }
    plVar7 = plVar7 + -10;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0);
  return bVar17;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(changed)
    {
    *changed = false;
    }
  int rp_count = 0;
  cmSystemToolsRPathInfo rp[2];
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  const char* se_name[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count] = se_rpath;
    se_name[se_count] = "RPATH";
    ++se_count;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count] = se_runpath;
    se_name[se_count] = "RUNPATH";
    ++se_count;
    }
  if(se_count == 0)
    {
    if(newRPath.empty())
      {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
      }
    else
      {
      if(emsg)
        {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
        }
      return false;
      }
    }

  for(int i=0; i < se_count; ++i)
    {
    // If both RPATH and RUNPATH refer to the same string literal it
    // needs to be changed only once.
    if(rp_count && rp[0].Position == se[i]->Position)
      {
      continue;
      }

    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos =
      cmSystemToolsFindRPath(se[i]->Value, oldRPath);
    if(pos == std::string::npos)
      {
      // If it contains the new rpath instead then it is okay.
      if(cmSystemToolsFindRPath(se[i]->Value, newRPath) != std::string::npos)
        {
        continue;
        }
      if(emsg)
        {
        std::ostringstream e;
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        *emsg = e.str();
        }
      return false;
      }

    // Store information about the entry in the file.
    rp[rp_count].Position = se[i]->Position;
    rp[rp_count].Size = se[i]->Size;
    rp[rp_count].Name = se_name[i];

    // Construct the new value which preserves the part of the path
    // not being changed.
    rp[rp_count].Value = se[i]->Value.substr(0, pos);
    rp[rp_count].Value += newRPath;
    rp[rp_count].Value += se[i]->Value.substr(pos+oldRPath.length(),
                                              oldRPath.npos);

    // Make sure there is enough room to store the new rpath and at
    // least one null terminator.
    if(rp[rp_count].Size < rp[rp_count].Value.length()+1)
      {
      if(emsg)
        {
        *emsg = "The replacement path is too long for the ";
        *emsg += se_name[i];
        *emsg += " entry.";
        }
      return false;
      }

    // This entry is ready for update.
    ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if(rp_count == 0)
    {
    return true;
    }

  {
  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Store the new RPATH and RUNPATH strings.
  for(int i=0; i < rp_count; ++i)
    {
    // Seek to the RPATH position.
    if(!f.seekp(rp[i].Position))
      {
      if(emsg)
        {
        *emsg = "Error seeking to ";
        *emsg += rp[i].Name;
        *emsg += " position.";
        }
      return false;
      }

    // Write the new rpath.  Follow it with enough null terminators to
    // fill the string table entry.
    f << rp[i].Value;
    for(unsigned long j=rp[i].Value.length(); j < rp[i].Size; ++j)
      {
      f << '\0';
      }

    // Make sure it wrote correctly.
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the new ";
        *emsg += rp[i].Name;
        *emsg += " string to the file.";
        }
      return false;
      }
    }
  }

  // Everything was updated successfully.
  if(changed)
    {
    *changed = true;
    }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}